

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCFuncPtr NULLC::FunctionRedirect(NULLCRef r,NULLCArray *arr)

{
  NULLCFuncPtr NVar1;
  uint typeID;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint local_2c;
  uint found;
  uint *funcs;
  NULLCArray *arr_local;
  NULLCFuncPtr ret;
  
  memset((void *)((long)&arr_local + 4),0,0xc);
  if (arr == (NULLCArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    pcVar2 = arr->ptr;
    if (r.typeID < arr->len) {
      if (*(int *)(pcVar2 + (ulong)r.typeID * 4) == 0) {
        local_2c = 0;
        while ((local_2c < arr->len && (*(int *)(pcVar2 + (ulong)local_2c * 4) == 0))) {
          local_2c = local_2c + 1;
        }
        if (local_2c == arr->len) {
          pcVar2 = nullcGetTypeName(r.typeID);
          nullcThrowError("ERROR: type \'%s\' doesn\'t implement method",pcVar2);
        }
        else {
          pcVar3 = nullcGetTypeName(r.typeID);
          pcVar4 = nullcGetTypeName(r.typeID);
          pcVar5 = nullcGetFunctionName(*(uint *)(pcVar2 + (ulong)local_2c * 4));
          pcVar5 = strchr(pcVar5,0x3a);
          typeID = nullcGetFunctionType(*(uint *)(pcVar2 + (ulong)local_2c * 4));
          pcVar2 = nullcGetTypeName(typeID);
          nullcThrowError("ERROR: type \'%s\' doesn\'t implement method \'%s%s\' of type \'%s\'",
                          pcVar3,pcVar4,pcVar5,pcVar2);
        }
      }
      else {
        unique0x00012000 = r.ptr;
        ret.context._0_4_ = *(uint *)(pcVar2 + (ulong)r.typeID * 4);
      }
    }
    else {
      nullcThrowError("ERROR: type index is out of bounds of redirection table");
    }
  }
  NVar1.id = (uint)ret.context;
  NVar1.context = stack0xffffffffffffffec;
  return NVar1;
}

Assistant:

NULLCFuncPtr NULLC::FunctionRedirect(NULLCRef r, NULLCArray* arr)
{
	NULLCFuncPtr ret = { 0, 0 };

	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}

	unsigned int *funcs = (unsigned int*)arr->ptr;
	if(r.typeID >= arr->len)
	{
		nullcThrowError("ERROR: type index is out of bounds of redirection table");
		return ret;
	}

	// If there is no implementation for a method
	if(!funcs[r.typeID])
	{
		// Find implemented function ID as a type reference
		unsigned int found = 0;
		for(; found < arr->len; found++)
		{
			if(funcs[found])
				break;
		}

		if(found == arr->len)
			nullcThrowError("ERROR: type '%s' doesn't implement method", nullcGetTypeName(r.typeID));
		else
			nullcThrowError("ERROR: type '%s' doesn't implement method '%s%s' of type '%s'", nullcGetTypeName(r.typeID), nullcGetTypeName(r.typeID), strchr(nullcGetFunctionName(funcs[found]), ':'), nullcGetTypeName(nullcGetFunctionType(funcs[found])));
		return ret;
	}

	ret.context = r.ptr;
	ret.id = funcs[r.typeID];

	return ret;
}